

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::processInfeasibleVertices(HighsCliqueTable *this,HighsDomain *globaldom)

{
  pointer pCVar1;
  pointer puVar2;
  pointer pHVar3;
  pointer pHVar4;
  bool bVar5;
  uint uVar6;
  CliqueVar v;
  HighsHashTree<int,_int> vHashLists;
  HighsHashTree<int,_void> vHashListsSizeTwo;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clq;
  CliqueVar local_8c;
  NodePtr local_88;
  NodePtr local_80;
  anon_class_24_3_e13e751c local_78;
  double local_58;
  double local_50;
  anon_class_24_3_389c80ea local_48;
  
  while( true ) {
    do {
      pCVar1 = (this->infeasvertexstack).
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((this->infeasvertexstack).
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           ._M_impl.super__Vector_impl_data._M_start == pCVar1) || (globaldom->infeasible_ != false)
         ) {
        propagateAndCleanup(this,globaldom);
        return;
      }
      local_8c = (CliqueVar)((uint)pCVar1[-1] ^ 0x80000000);
      (this->infeasvertexstack).
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar1 + -1;
      resolveSubstitution(this,&local_8c);
      uVar6 = (uint)local_8c & 0x7fffffff;
      local_50 = (globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar6];
      local_58 = (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar6];
      HighsDomain::fixCol(globaldom,uVar6,(double)((uint)local_8c >> 0x1f),(Reason)0xfffffffe);
      if (globaldom->infeasible_ == true) {
        return;
      }
      if ((local_50 != local_58) || (NAN(local_50) || NAN(local_58))) {
        this->nfixings = this->nfixings + 1;
      }
      puVar2 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (puVar2[(uint)local_8c & 0x7fffffff] != '\0');
    puVar2[(uint)local_8c & 0x7fffffff] = '\x01';
    uVar6 = (int)local_8c << 1 | (uint)((int)local_8c < 0);
    pHVar3 = (this->invertedHashList).
             super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_88.ptrAndType = pHVar3[(int)uVar6].root.ptrAndType;
    pHVar3[(int)uVar6].root.ptrAndType = 0;
    pHVar4 = (this->invertedHashListSizeTwo).
             super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80.ptrAndType = pHVar4[(int)uVar6].root.ptrAndType;
    pHVar4[(int)uVar6].root.ptrAndType = 0;
    local_78.this = this;
    local_78.v = &local_8c;
    local_78.globaldom = globaldom;
    bVar5 = HighsHashTree<int,_int>::
            for_each_recurse<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1535:39)_&,_0>
                      (local_88,&local_78);
    if ((bVar5) ||
       (local_78.this = this, local_78.v = &local_8c, local_78.globaldom = globaldom,
       bVar5 = HighsHashTree<int,_void>::
               for_each_recurse<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1558:41)_&,_0>
                         (local_80,&local_78), bVar5)) break;
    HighsHashTree<int,_int>::operator=
              ((HighsHashTree<int,_int> *)&local_88,
               (this->invertedHashList).
               super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (int)((int)local_8c << 1 | (uint)((int)((uint)local_8c ^ 0x80000000) < 0)));
    HighsHashTree<int,_void>::operator=
              ((HighsHashTree<int,_void> *)&local_80,
               (this->invertedHashListSizeTwo).
               super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (int)((int)local_8c << 1 | (uint)((int)((uint)local_8c ^ 0x80000000) < 0)));
    if (this->inPresolve == true) {
      local_78.this = this;
      HighsHashTree<int,_int>::
      for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1590:27)_&,_0>
                (local_88,(anon_class_8_1_8991fb9c *)&local_78);
    }
    else {
      local_78.this = this;
      HighsHashTree<int,_void>::
      for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1601:9)_&,_0>
                (local_80,(anon_class_8_1_8991fb9c *)&local_78);
      local_78.this = (HighsCliqueTable *)0x0;
      local_78.v = (CliqueVar *)0x0;
      local_78.globaldom = (HighsDomain *)0x0;
      local_48.this = this;
      local_48.clq = (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)&local_78;
      local_48.globaldom = globaldom;
      HighsHashTree<int,_int>::
      for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:1605:25)_&,_0>
                (local_88,&local_48);
      std::_Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      ~_Vector_base((_Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     *)&local_78);
    }
    HighsHashTree<int,_void>::~HighsHashTree((HighsHashTree<int,_void> *)&local_80);
    HighsHashTree<int,_int>::~HighsHashTree((HighsHashTree<int,_int> *)&local_88);
  }
  HighsHashTree<int,_void>::~HighsHashTree((HighsHashTree<int,_void> *)&local_80);
  HighsHashTree<int,_int>::~HighsHashTree((HighsHashTree<int,_int> *)&local_88);
  return;
}

Assistant:

void HighsCliqueTable::processInfeasibleVertices(HighsDomain& globaldom) {
  while (!infeasvertexstack.empty() && !globaldom.infeasible()) {
    CliqueVar v = infeasvertexstack.back().complement();
    infeasvertexstack.pop_back();

    resolveSubstitution(v);
    bool wasfixed = globaldom.isFixed(v.col);
    globaldom.fixCol(v.col, double(v.val));
    if (globaldom.infeasible()) return;
    if (!wasfixed) ++nfixings;
    if (colDeleted[v.col]) continue;
    colDeleted[v.col] = true;

    HighsHashTree<HighsInt, HighsInt> vHashLists =
        std::move(invertedHashList[v.index()]);
    HighsHashTree<HighsInt> vHashListsSizeTwo =
        std::move(invertedHashListSizeTwo[v.index()]);

    bool infeas = vHashLists.for_each([&](HighsInt cliqueid) {
      HighsInt start = cliques[cliqueid].start;
      HighsInt end = cliques[cliqueid].end;

      for (HighsInt i = start; i != end; ++i) {
        if (cliqueentries[i].col == v.col) continue;

        bool wasfixed = globaldom.isFixed(cliqueentries[i].col);
        globaldom.fixCol(cliqueentries[i].col,
                         double(1 - cliqueentries[i].val));
        if (globaldom.infeasible()) return true;
        if (!wasfixed) {
          ++nfixings;
          infeasvertexstack.push_back(cliqueentries[i]);
        }
      }

      removeClique(cliqueid);
      return false;
    });

    if (infeas) return;

    infeas = vHashListsSizeTwo.for_each([&](HighsInt cliqueid) {
      HighsInt start = cliques[cliqueid].start;
      HighsInt end = cliques[cliqueid].end;

      for (HighsInt i = start; i != end; ++i) {
        if (cliqueentries[i].col == v.col) continue;

        bool wasfixed = globaldom.isFixed(cliqueentries[i].col);
        globaldom.fixCol(cliqueentries[i].col,
                         double(1 - cliqueentries[i].val));
        if (globaldom.infeasible()) return true;
        if (!wasfixed) {
          ++nfixings;
          infeasvertexstack.push_back(cliqueentries[i]);
        }
      }

      removeClique(cliqueid);
      return false;
    });

    if (infeas) return;

    vHashLists = std::move(invertedHashList[v.complement().index()]);
    vHashListsSizeTwo =
        std::move(invertedHashListSizeTwo[v.complement().index()]);

    if (inPresolve) {
      // during presolve we only count the number of zeros within each clique
      // and only remove fully redundant cliques that are larger than two
      // in the process since during presolve a lot of cliques of size two
      // may be found by probing and will be deleted upon rebuild anyways
      vHashLists.for_each([&](HighsInt cliqueid) {
        cliques[cliqueid].numZeroFixed += 1;
        if (cliques[cliqueid].end - cliques[cliqueid].start -
                cliques[cliqueid].numZeroFixed <=
            1)
          removeClique(cliqueid);
      });
      continue;
    }

    vHashListsSizeTwo.for_each(
        [&](HighsInt cliqueid) { removeClique(cliqueid); });

    assert(cliquehitinds.empty());
    std::vector<CliqueVar> clq;
    vHashLists.for_each([&](HighsInt cliqueid) {
      // assert(cliqueentries[entry.value()].val == 1 - v.val);

      cliques[cliqueid].numZeroFixed += 1;
      if (cliques[cliqueid].end - cliques[cliqueid].start -
              cliques[cliqueid].numZeroFixed <=
          1) {
        removeClique(cliqueid);
      } else if (cliques[cliqueid].numZeroFixed >=
                 std::max(
                     HighsInt{10},
                     (cliques[cliqueid].end - cliques[cliqueid].start) >> 1)) {
        clq.assign(cliqueentries.begin() + cliques[cliqueid].start,
                   cliqueentries.begin() + cliques[cliqueid].end);

        auto computeNumDeleted = [&](const std::vector<CliqueVar>& clq) {
          HighsInt numDel = 0;
          for (CliqueVar x : clq) numDel += colDeleted[x.col];
          return numDel;
        };

        assert(computeNumDeleted(clq) == cliques[cliqueid].numZeroFixed);

        removeClique(cliqueid);
        clq.erase(std::remove_if(clq.begin(), clq.end(),
                                 [&](CliqueVar x) {
                                   return globaldom.isFixed(x.col) &&
                                          globaldom.col_lower_[x.col] ==
                                              1 - x.val;
                                 }),
                  clq.end());
        if (clq.size() > 1) doAddClique(clq.data(), clq.size());
      }
    });
  }

  propagateAndCleanup(globaldom);
}